

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::LineState,_char> *jo)

{
  LineState *pLVar1;
  ostream *poVar2;
  JObject *pJVar3;
  JObject local_30;
  char local_1b [3];
  
  pLVar1 = jo->object;
  local_30.sep = "";
  local_30.os = os;
  std::operator<<(os,"{ ");
  local_1b[0] = '\0';
  pJVar3 = JObject::field<char[5],pstack::Dwarf::FileEntry,char>
                     (&local_30,(char (*) [5])0x17eead,pLVar1->file,local_1b);
  local_1b[1] = 0;
  pJVar3 = JObject::field<char[5],unsigned_int,char>
                     (pJVar3,(char (*) [5])0x17ec43,&pLVar1->line,local_1b + 1);
  local_1b[2] = 0;
  pJVar3 = JObject::field<char[5],unsigned_long,char>
                     (pJVar3,(char (*) [5])0x180841,&pLVar1->addr,local_1b + 2);
  poVar2 = pJVar3->os;
  JObject::~JObject(&local_30);
  return poVar2;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::LineState, C> &jo) {
    auto &ls = jo.object;
    return JObject(os)
        .field("file", *ls.file)
        .field("line", ls.line)
        .field("addr", ls.addr);
}